

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_constants.cpp
# Opt level: O2

spv_result_t spvtools::val::ConstantPass(ValidationState_t *_,Instruction *inst)

{
  uint16_t uVar1;
  bool bVar2;
  uint id;
  int32_t iVar3;
  Op opcode;
  uint uVar4;
  uint uVar5;
  Instruction *pIVar6;
  long lVar7;
  Instruction *this;
  char *pcVar8;
  Instruction *pIVar9;
  Instruction *pIVar10;
  Instruction *pIVar11;
  byte bVar12;
  spv_result_t sVar13;
  spv_result_t sVar14;
  size_t index;
  ulong index_00;
  ulong uVar15;
  string opcode_name;
  string local_250;
  Instruction *local_230;
  string local_228;
  undefined1 local_208 [5];
  char local_203;
  spv_result_t local_38;
  
  switch((inst->inst_).opcode) {
  case 0x29:
  case 0x2a:
  case 0x30:
  case 0x31:
    pIVar6 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar6 != (Instruction *)0x0) && ((pIVar6->inst_).opcode == 0x14))
    goto switchD_0056ab31_caseD_2b;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::operator<<((ostream *)local_208,"Op");
    pcVar8 = spvOpcodeString((uint)(inst->inst_).opcode);
    std::operator<<((ostream *)local_208,pcVar8);
    std::operator<<((ostream *)local_208," Result Type <id> ");
    ValidationState_t::getIdName_abi_cxx11_(&opcode_name,_,(inst->inst_).type_id);
    std::operator<<((ostream *)local_208,(string *)&opcode_name);
    pcVar8 = " is not a boolean type.";
    break;
  default:
    goto switchD_0056ab31_caseD_2b;
  case 0x2c:
  case 0x33:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_208,"Op",(allocator<char> *)&local_250);
    pcVar8 = spvOpcodeString((uint)(inst->inst_).opcode);
    std::operator+(&opcode_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                   pcVar8);
    std::__cxx11::string::_M_dispose();
    pIVar6 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar6 == (Instruction *)0x0) ||
       (iVar3 = spvOpcodeIsComposite((uint)(pIVar6->inst_).opcode), iVar3 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)local_208,(string *)&opcode_name);
      std::operator<<((ostream *)local_208," Result Type <id> ");
      ValidationState_t::getIdName_abi_cxx11_(&local_250,_,(inst->inst_).type_id);
      std::operator<<((ostream *)local_208,(string *)&local_250);
      pcVar8 = " is not a composite type.";
LAB_0056ae8b:
      std::operator<<((ostream *)local_208,pcVar8);
LAB_0056ae9d:
      sVar14 = local_38;
      std::__cxx11::string::_M_dispose();
      goto LAB_0056aea5;
    }
    lVar7 = (long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 2;
    uVar15 = lVar7 - 3;
    uVar1 = (pIVar6->inst_).opcode;
    sVar13 = SPV_SUCCESS;
    sVar14 = SPV_SUCCESS;
    switch(uVar1) {
    case 0x17:
switchD_0056ac7b_caseD_17:
      uVar4 = ValidationState_t::GetDimension(_,(pIVar6->inst_).result_id);
      if ((pIVar6->inst_).opcode == 0x14a8) {
        uVar4 = Instruction::GetOperandAs<unsigned_int>(pIVar6,2);
        ValidationState_t::EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,_,uVar4);
        bVar12 = local_208[4] ^ 1;
        uVar4 = local_208._0_4_;
      }
      else {
        bVar12 = 0;
      }
      if ((bVar12 == 0) && (uVar15 != uVar4)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)local_208,(string *)&opcode_name);
        std::operator<<((ostream *)local_208,
                        " Constituent <id> count does not match Result Type <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&local_250,_,(pIVar6->inst_).result_id);
        std::operator<<((ostream *)local_208,(string *)&local_250);
        pcVar8 = "s vector component count.";
LAB_0056b810:
        std::operator<<((ostream *)local_208,pcVar8);
        sVar14 = local_38;
      }
      else {
        uVar4 = Instruction::GetOperandAs<unsigned_int>(pIVar6,1);
        pIVar10 = ValidationState_t::FindDef(_,uVar4);
        pIVar11 = pIVar6;
        if (pIVar10 == (Instruction *)0x0) goto LAB_0056bb3d;
        uVar15 = 2;
        do {
          if ((ulong)((long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar15) {
            sVar14 = SPV_SUCCESS;
            goto switchD_0056ac7b_caseD_19;
          }
          uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,uVar15);
          pIVar11 = ValidationState_t::FindDef(_,uVar4);
          if ((pIVar11 == (Instruction *)0x0) ||
             (bVar2 = spvOpcodeIsConstantOrUndef((uint)(pIVar11->inst_).opcode), !bVar2)) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)local_208,(string *)&opcode_name);
            std::operator<<((ostream *)local_208," Constituent <id> ");
LAB_0056bc34:
            ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar4);
            std::operator<<((ostream *)local_208,(string *)&local_250);
            pcVar8 = " is not a constant or undef.";
            goto LAB_0056ae8b;
          }
          pIVar11 = ValidationState_t::FindDef(_,(pIVar11->inst_).type_id);
        } while ((pIVar11 != (Instruction *)0x0) &&
                (uVar15 = uVar15 + 1, (pIVar10->inst_).result_id == (pIVar11->inst_).result_id));
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)local_208,(string *)&opcode_name);
        std::operator<<((ostream *)local_208," Constituent <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar4);
        std::operator<<((ostream *)local_208,(string *)&local_250);
        std::operator<<((ostream *)local_208,"s type does not match Result Type <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&local_228,_,(pIVar6->inst_).result_id);
        std::operator<<((ostream *)local_208,(string *)&local_228);
        pcVar8 = "s vector element type.";
LAB_0056b8b0:
        std::operator<<((ostream *)local_208,pcVar8);
        sVar14 = local_38;
        std::__cxx11::string::_M_dispose();
      }
      std::__cxx11::string::_M_dispose();
      break;
    case 0x18:
      uVar4 = Instruction::GetOperandAs<unsigned_int>(pIVar6,2);
      if (uVar15 != uVar4) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)local_208,(string *)&opcode_name);
        std::operator<<((ostream *)local_208,
                        " Constituent <id> count does not match Result Type <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&local_250,_,(pIVar6->inst_).result_id);
        std::operator<<((ostream *)local_208,(string *)&local_250);
        pcVar8 = "s matrix column count.";
        goto LAB_0056b810;
      }
      pIVar11 = ValidationState_t::FindDef
                          (_,(pIVar6->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[2]);
      if (pIVar11 == (Instruction *)0x0) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar6);
        pcVar8 = "Column type is not defined.";
        goto LAB_0056bb49;
      }
      uVar15 = 2;
      uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar11,2);
      uVar4 = Instruction::GetOperandAs<unsigned_int>(pIVar11,1);
      pIVar9 = ValidationState_t::FindDef(_,uVar4);
      if (pIVar9 != (Instruction *)0x0) {
        do {
          local_230 = pIVar11;
          sVar14 = sVar13;
          if ((ulong)((long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar15)
          goto switchD_0056ac7b_caseD_19;
          uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,uVar15);
          pIVar10 = ValidationState_t::FindDef(_,uVar4);
          if ((pIVar10 == (Instruction *)0x0) ||
             (bVar2 = spvOpcodeIsConstantOrUndef((uint)(pIVar10->inst_).opcode), !bVar2)) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)local_208,(string *)&opcode_name);
            std::operator<<((ostream *)local_208," Constituent <id> ");
            goto LAB_0056bc34;
          }
          this = ValidationState_t::FindDef(_,(pIVar10->inst_).type_id);
          if (this == (Instruction *)0x0) goto LAB_0056bbcb;
          if ((local_230->inst_).opcode != (this->inst_).opcode) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)local_208,(string *)&opcode_name);
            std::operator<<((ostream *)local_208," Constituent <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar4);
            std::operator<<((ostream *)local_208,(string *)&local_250);
            std::operator<<((ostream *)local_208," type does not match Result Type <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&local_228,_,(pIVar6->inst_).result_id);
            std::operator<<((ostream *)local_208,(string *)&local_228);
            pcVar8 = "s matrix column type.";
            goto LAB_0056bafb;
          }
          id = Instruction::GetOperandAs<unsigned_int>(this,1);
          pIVar11 = ValidationState_t::FindDef(_,id);
          if ((pIVar9->inst_).result_id != (pIVar11->inst_).result_id) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)local_208,(string *)&opcode_name);
            std::operator<<((ostream *)local_208," Constituent <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar4);
            std::operator<<((ostream *)local_208,(string *)&local_250);
            std::operator<<((ostream *)local_208," component type does not match Result Type <id> ")
            ;
            ValidationState_t::getIdName_abi_cxx11_(&local_228,_,(pIVar6->inst_).result_id);
            std::operator<<((ostream *)local_208,(string *)&local_228);
            pcVar8 = "s matrix column component type.";
            goto LAB_0056bafb;
          }
          uVar15 = uVar15 + 1;
          pIVar11 = local_230;
        } while (uVar5 == (this->words_).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[3]);
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)local_208,(string *)&opcode_name);
        std::operator<<((ostream *)local_208," Constituent <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar4);
        std::operator<<((ostream *)local_208,(string *)&local_250);
        std::operator<<((ostream *)local_208,
                        " vector component count does not match Result Type <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&local_228,_,(pIVar6->inst_).result_id);
        std::operator<<((ostream *)local_208,(string *)&local_228);
        pcVar8 = "s vector component count.";
        goto LAB_0056bafb;
      }
LAB_0056bb3d:
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar11);
      pcVar8 = "Component type is not defined.";
LAB_0056bb49:
      std::operator<<((ostream *)local_208,pcVar8);
      sVar14 = local_38;
      break;
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1d:
      goto switchD_0056ac7b_caseD_19;
    case 0x1c:
      uVar4 = Instruction::GetOperandAs<unsigned_int>(pIVar6,1);
      pIVar11 = ValidationState_t::FindDef(_,uVar4);
      if (pIVar11 == (Instruction *)0x0) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar6);
        pcVar8 = "Element type is not defined.";
        goto LAB_0056bb49;
      }
      index_00 = 2;
      uVar4 = Instruction::GetOperandAs<unsigned_int>(pIVar6,2);
      pIVar10 = ValidationState_t::FindDef(_,uVar4);
      if (pIVar10 != (Instruction *)0x0) {
        ValidationState_t::EvalInt32IfConst
                  ((tuple<bool,_bool,_unsigned_int> *)local_208,_,(pIVar10->inst_).result_id);
        if (((local_203 != '\x01') || (local_208[4] == false)) || (uVar15 == (uint)local_208._0_4_))
        {
          do {
            sVar14 = sVar13;
            if ((ulong)((long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4) <= index_00)
            goto switchD_0056ac7b_caseD_19;
            uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,index_00);
            pIVar10 = ValidationState_t::FindDef(_,uVar4);
            if ((pIVar10 == (Instruction *)0x0) ||
               (bVar2 = spvOpcodeIsConstantOrUndef((uint)(pIVar10->inst_).opcode), !bVar2)) {
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
              std::operator<<((ostream *)local_208,(string *)&opcode_name);
              std::operator<<((ostream *)local_208," Constituent <id> ");
              ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar4);
              std::operator<<((ostream *)local_208,(string *)&local_250);
              std::operator<<((ostream *)local_208," is not a constant or undef.");
              sVar14 = local_38;
              goto LAB_0056bb12;
            }
            pIVar9 = ValidationState_t::FindDef(_,(pIVar10->inst_).type_id);
            if (pIVar9 == (Instruction *)0x0) goto LAB_0056bbcb;
            index_00 = index_00 + 1;
          } while ((pIVar11->inst_).result_id == (pIVar9->inst_).result_id);
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)local_208,(string *)&opcode_name);
          std::operator<<((ostream *)local_208," Constituent <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar4);
          std::operator<<((ostream *)local_208,(string *)&local_250);
          std::operator<<((ostream *)local_208,"s type does not match Result Type <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&local_228,_,(pIVar6->inst_).result_id);
          std::operator<<((ostream *)local_208,(string *)&local_228);
          pcVar8 = "s array element type.";
          goto LAB_0056bafb;
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)local_208,(string *)&opcode_name);
        std::operator<<((ostream *)local_208," Constituent count does not match Result Type <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&local_250,_,(pIVar6->inst_).result_id);
        std::operator<<((ostream *)local_208,(string *)&local_250);
        pcVar8 = "s array length.";
        goto LAB_0056b810;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar6);
      pcVar8 = "Length is not defined.";
LAB_0056ba11:
      std::operator<<((ostream *)local_208,pcVar8);
      sVar14 = local_38;
      break;
    case 0x1e:
      if ((long)(pIVar6->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pIVar6->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start >> 2 != lVar7 + -1) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)local_208,(string *)&opcode_name);
        std::operator<<((ostream *)local_208," Constituent <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&local_250,_,(inst->inst_).type_id);
        std::operator<<((ostream *)local_208,(string *)&local_250);
        std::operator<<((ostream *)local_208," count does not match Result Type <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&local_228,_,(pIVar6->inst_).result_id);
        std::operator<<((ostream *)local_208,(string *)&local_228);
        pcVar8 = "s struct member count.";
        goto LAB_0056b8b0;
      }
      index = 1;
      do {
        uVar15 = (ulong)((int)index + 1);
        sVar14 = sVar13;
        if ((ulong)((long)(inst->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(inst->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar15)
        goto switchD_0056ac7b_caseD_19;
        uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,uVar15);
        pIVar11 = ValidationState_t::FindDef(_,uVar4);
        if ((pIVar11 == (Instruction *)0x0) ||
           (bVar2 = spvOpcodeIsConstantOrUndef((uint)(pIVar11->inst_).opcode), !bVar2)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)local_208,(string *)&opcode_name);
          std::operator<<((ostream *)local_208," Constituent <id> ");
          goto LAB_0056bc34;
        }
        pIVar10 = ValidationState_t::FindDef(_,(pIVar11->inst_).type_id);
        if (pIVar10 == (Instruction *)0x0) goto LAB_0056b9f1;
        uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar6,index);
        pIVar11 = ValidationState_t::FindDef(_,uVar5);
      } while ((pIVar11 != (Instruction *)0x0) &&
              (index = uVar15, (pIVar11->inst_).result_id == (pIVar10->inst_).result_id));
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)local_208,(string *)&opcode_name);
      std::operator<<((ostream *)local_208," Constituent <id> ");
      ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar4);
      std::operator<<((ostream *)local_208,(string *)&local_250);
      std::operator<<((ostream *)local_208," type does not match the Result Type <id> ");
      ValidationState_t::getIdName_abi_cxx11_(&local_228,_,(pIVar6->inst_).result_id);
      std::operator<<((ostream *)local_208,(string *)&local_228);
      pcVar8 = "s member type.";
LAB_0056bafb:
      std::operator<<((ostream *)local_208,pcVar8);
      sVar14 = local_38;
      std::__cxx11::string::_M_dispose();
LAB_0056bb12:
      std::__cxx11::string::_M_dispose();
      break;
    default:
      if ((uVar1 == 0x1168) || (uVar1 == 0x14ee)) {
        if (uVar15 != 1) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)local_208,(string *)&opcode_name);
          std::operator<<((ostream *)local_208," Constituent <id> ");
          ValidationState_t::getIdName_abi_cxx11_(&local_250,_,(inst->inst_).type_id);
          std::operator<<((ostream *)local_208,(string *)&local_250);
          pcVar8 = " count must be one.";
          goto LAB_0056ae8b;
        }
        uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,2);
        pIVar11 = ValidationState_t::FindDef(_,uVar4);
        if ((pIVar11 != (Instruction *)0x0) &&
           (bVar2 = spvOpcodeIsConstantOrUndef((uint)(pIVar11->inst_).opcode), bVar2)) {
          pIVar10 = ValidationState_t::FindDef(_,(pIVar11->inst_).type_id);
          if (pIVar10 == (Instruction *)0x0) {
LAB_0056b9f1:
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar11);
            pcVar8 = "Result type is not defined.";
            goto LAB_0056ba11;
          }
          uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar6,1);
          pIVar11 = ValidationState_t::FindDef(_,uVar5);
          if ((pIVar11 == (Instruction *)0x0) ||
             (sVar14 = sVar13, (pIVar11->inst_).result_id != (pIVar10->inst_).result_id)) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)local_208,(string *)&opcode_name);
            std::operator<<((ostream *)local_208," Constituent <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar4);
            std::operator<<((ostream *)local_208,(string *)&local_250);
            std::operator<<((ostream *)local_208," type does not match the Result Type <id> ");
            ValidationState_t::getIdName_abi_cxx11_(&local_228,_,(pIVar6->inst_).result_id);
            std::operator<<((ostream *)local_208,(string *)&local_228);
            pcVar8 = "s component type.";
            goto LAB_0056bafb;
          }
          goto switchD_0056ac7b_caseD_19;
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)local_208,(string *)&opcode_name);
        std::operator<<((ostream *)local_208," Constituent <id> ");
        ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar4);
        std::operator<<((ostream *)local_208,(string *)&local_250);
        std::operator<<((ostream *)local_208," is not a constant or undef.");
        goto LAB_0056ae9d;
      }
      if (uVar1 == 0x14a8) goto switchD_0056ac7b_caseD_17;
      goto switchD_0056ac7b_caseD_19;
    }
LAB_0056aea5:
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
switchD_0056ac7b_caseD_19:
    std::__cxx11::string::_M_dispose();
    goto LAB_0056aeb4;
  case 0x2d:
    pIVar6 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar6 != (Instruction *)0x0) && ((pIVar6->inst_).opcode == 0x1a))
    goto switchD_0056ab31_caseD_2b;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar6);
    std::operator<<((ostream *)local_208,"OpConstantSampler Result Type <id> ");
    ValidationState_t::getIdName_abi_cxx11_(&opcode_name,_,(inst->inst_).type_id);
    std::operator<<((ostream *)local_208,(string *)&opcode_name);
    pcVar8 = " is not a sampler type.";
    break;
  case 0x2e:
    pIVar6 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar6 != (Instruction *)0x0) &&
       (bVar2 = anon_unknown_1::IsTypeNullable(&pIVar6->words_,_), bVar2))
    goto switchD_0056ab31_caseD_2b;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::operator<<((ostream *)local_208,"OpConstantNull Result Type <id> ");
    ValidationState_t::getIdName_abi_cxx11_(&opcode_name,_,(inst->inst_).type_id);
    std::operator<<((ostream *)local_208,(string *)&opcode_name);
    pcVar8 = " cannot have a null value.";
    break;
  case 0x32:
    uVar4 = Instruction::GetOperandAs<unsigned_int_const>(inst,0);
    pIVar6 = ValidationState_t::FindDef(_,uVar4);
    if (0xfffffffd < (pIVar6->inst_).opcode - 0x17) goto switchD_0056ab31_caseD_2b;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar8 = "Specialization constant must be an integer or floating-point number.";
LAB_0056b107:
    std::operator<<((ostream *)local_208,pcVar8);
    sVar14 = local_38;
    goto LAB_0056abd8;
  case 0x34:
    opcode = Instruction::GetOperandAs<spv::Op>(inst,2);
    uVar15 = (ulong)(opcode - OpAccessChain);
    if (opcode - OpAccessChain < 0x3f) {
      if ((0x4b90f00000000027U >> (uVar15 & 0x3f) & 1) == 0) {
        if (uVar15 == 0x30) {
          if (((_->features_).uconvert_spec_constant_op != false) ||
             (bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityKernel),
             bVar2)) goto switchD_0056ab31_caseD_2b;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar8 = 
          "Prior to SPIR-V 1.4, specialization constant operation UConvert requires Kernel capability or extension SPV_AMD_gpu_shader_int16"
          ;
        }
        else {
          if (uVar15 != 0x33) goto LAB_0056b18f;
          bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
          if (bVar2) goto switchD_0056ab31_caseD_2b;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)local_208,"Specialization constant operation ");
          pcVar8 = spvOpcodeString(OpQuantizeToF16);
          std::operator<<((ostream *)local_208,pcVar8);
          pcVar8 = " requires Shader capability";
        }
        goto LAB_0056b107;
      }
    }
    else {
LAB_0056b18f:
      if ((0xc < opcode - OpFAdd) || ((0x1895U >> (opcode - OpFAdd & 0x1f) & 1) == 0))
      goto switchD_0056ab31_caseD_2b;
    }
    bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityKernel);
    if (bVar2) goto switchD_0056ab31_caseD_2b;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::operator<<((ostream *)local_208,"Specialization constant operation ");
    pcVar8 = spvOpcodeString(opcode);
    std::operator<<((ostream *)local_208,pcVar8);
    std::operator<<((ostream *)local_208," requires Kernel capability");
    sVar14 = local_38;
    goto LAB_0056abd8;
  }
  std::operator<<((ostream *)local_208,pcVar8);
  sVar14 = local_38;
  std::__cxx11::string::_M_dispose();
LAB_0056abd8:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
LAB_0056aeb4:
  if (sVar14 != SPV_SUCCESS) {
    return sVar14;
  }
switchD_0056ab31_caseD_2b:
  iVar3 = spvOpcodeIsConstant((uint)(inst->inst_).opcode);
  sVar14 = SPV_SUCCESS;
  if ((((iVar3 != 0) &&
       (bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader), bVar2
       )) && (bVar2 = ValidationState_t::IsPointerType(_,(inst->inst_).type_id),
             sVar14 = SPV_SUCCESS, !bVar2)) &&
     (bVar2 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id), bVar2))
  {
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::operator<<((ostream *)local_208,"Cannot form constants of 8- or 16-bit types");
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    sVar14 = local_38;
  }
  return sVar14;
LAB_0056bbcb:
  ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar10);
  pcVar8 = "Result type is not defined.";
  goto LAB_0056bb49;
}

Assistant:

spv_result_t ConstantPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpConstantTrue:
    case spv::Op::OpConstantFalse:
    case spv::Op::OpSpecConstantTrue:
    case spv::Op::OpSpecConstantFalse:
      if (auto error = ValidateConstantBool(_, inst)) return error;
      break;
    case spv::Op::OpConstantComposite:
    case spv::Op::OpSpecConstantComposite:
      if (auto error = ValidateConstantComposite(_, inst)) return error;
      break;
    case spv::Op::OpConstantSampler:
      if (auto error = ValidateConstantSampler(_, inst)) return error;
      break;
    case spv::Op::OpConstantNull:
      if (auto error = ValidateConstantNull(_, inst)) return error;
      break;
    case spv::Op::OpSpecConstant:
      if (auto error = ValidateSpecConstant(_, inst)) return error;
      break;
    case spv::Op::OpSpecConstantOp:
      if (auto error = ValidateSpecConstantOp(_, inst)) return error;
      break;
    default:
      break;
  }

  // Generally disallow creating 8- or 16-bit constants unless the full
  // capabilities are present.
  if (spvOpcodeIsConstant(inst->opcode()) &&
      _.HasCapability(spv::Capability::Shader) &&
      !_.IsPointerType(inst->type_id()) &&
      _.ContainsLimitedUseIntOrFloatType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Cannot form constants of 8- or 16-bit types";
  }

  return SPV_SUCCESS;
}